

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O3

void cjson_create_array_reference_should_create_an_array_reference(void)

{
  cJSON *array;
  cJSON *item;
  cJSON *item_00;
  
  array = (cJSON *)(*global_hooks.allocate)(0x40);
  if (array != (cJSON *)0x0) {
    array->child = (cJSON *)0x0;
    *(undefined8 *)&array->type = 0;
    array->valuedouble = 0.0;
    array->string = (char *)0x0;
    array->valuestring = (char *)0x0;
    *(undefined8 *)&array->valueint = 0;
    array->next = (cJSON *)0x0;
    array->prev = (cJSON *)0x0;
    array->type = 0x20;
  }
  item = (cJSON *)(*global_hooks.allocate)(0x40);
  if (item == (cJSON *)0x0) {
    UnityFail(" Expected TRUE Was FALSE",0x263);
  }
  else {
    item->child = (cJSON *)0x0;
    *(undefined8 *)&item->type = 0;
    item->valuedouble = 0.0;
    item->string = (char *)0x0;
    item->valuestring = (char *)0x0;
    *(undefined8 *)&item->valueint = 0;
    item->next = (cJSON *)0x0;
    item->prev = (cJSON *)0x0;
    item->type = 8;
    item->valuedouble = 42.0;
    item->valueint = 0x2a;
  }
  if ((array == (cJSON *)0x0) || ((char)array->type != ' ')) {
    UnityFail(" Expected TRUE Was FALSE",0x264);
  }
  add_item_to_array(array,item);
  item_00 = (cJSON *)(*global_hooks.allocate)(0x40);
  if (item_00 == (cJSON *)0x0) {
    if (_DAT_00000010 != item) {
      UnityFail(" Expected TRUE Was FALSE",0x268);
    }
  }
  else {
    item_00->child = (cJSON *)0x0;
    *(undefined8 *)&item_00->type = 0;
    item_00->valuedouble = 0.0;
    item_00->string = (char *)0x0;
    item_00->valuestring = (char *)0x0;
    *(undefined8 *)&item_00->valueint = 0;
    item_00->next = (cJSON *)0x0;
    item_00->prev = (cJSON *)0x0;
    item_00->type = 0x120;
    item_00->child = item;
  }
  UnityAssertEqualNumber(0x120,(long)item_00->type,(char *)0x0,0x269,UNITY_DISPLAY_STYLE_INT);
  cJSON_Delete(array);
  cJSON_Delete(item_00);
  return;
}

Assistant:

static void cjson_create_array_reference_should_create_an_array_reference(void)
{
    cJSON *number_reference = NULL;
    cJSON *number_array = cJSON_CreateArray();
    cJSON *number = cJSON_CreateNumber(42);

    TEST_ASSERT_TRUE(cJSON_IsNumber(number));
    TEST_ASSERT_TRUE(cJSON_IsArray(number_array));
    cJSON_AddItemToArray(number_array, number);

    number_reference = cJSON_CreateArrayReference(number);
    TEST_ASSERT_TRUE(number_reference->child == number);
    TEST_ASSERT_EQUAL_INT(cJSON_Array | cJSON_IsReference, number_reference->type);

    cJSON_Delete(number_array);
    cJSON_Delete(number_reference);
}